

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O0

void __thiscall NPC::~NPC(NPC *this)

{
  Character *pCVar1;
  bool bVar2;
  list<Character_*,_std::allocator<Character_*>_> *this_00;
  reference ppCVar3;
  pointer pNVar4;
  iterator local_88;
  const_iterator local_80;
  NPC *local_78;
  _List_node_base *local_70;
  _List_iterator<NPC_*> local_68;
  iterator local_60;
  const_iterator local_58;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *local_50;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *opponent;
  iterator __end1_1;
  iterator __begin1_1;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *__range1_1;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  NPC *this_local;
  
  this_00 = &this->map->characters;
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_00);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_00);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&character);
    if (!bVar2) break;
    ppCVar3 = std::_List_iterator<Character_*>::operator*(&__end1);
    pCVar1 = *ppCVar3;
    if (pCVar1->npc == this) {
      pCVar1->npc = (NPC *)0x0;
      pCVar1->npc_type = NPC;
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  __end1_1 = std::__cxx11::
             list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
             ::begin(&this->damagelist);
  opponent = (unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
             std::__cxx11::
             list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
             ::end(&this->damagelist);
  while( true ) {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&opponent);
    if (!bVar2) break;
    local_50 = std::
               _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
               operator*(&__end1_1);
    pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->(local_50)
    ;
    pCVar1 = pNVar4->attacker;
    pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->(local_50)
    ;
    local_68._M_node =
         (_List_node_base *)
         std::begin<std::__cxx11::list<NPC*,std::allocator<NPC*>>>
                   (&pNVar4->attacker->unregister_npc);
    pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->(local_50)
    ;
    local_70 = (_List_node_base *)
               std::end<std::__cxx11::list<NPC*,std::allocator<NPC*>>>
                         (&pNVar4->attacker->unregister_npc);
    local_78 = this;
    local_60._M_node =
         (_List_node_base *)
         std::remove<std::_List_iterator<NPC*>,NPC*>
                   (local_68,(_List_iterator<NPC_*>)local_70,&local_78);
    std::_List_const_iterator<NPC_*>::_List_const_iterator(&local_58,&local_60);
    pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->(local_50)
    ;
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::end(&pNVar4->attacker->unregister_npc);
    std::_List_const_iterator<NPC_*>::_List_const_iterator(&local_80,&local_88);
    std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
              (&pCVar1->unregister_npc,local_58,local_80);
    std::_List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
    operator++(&__end1_1);
  }
  std::__cxx11::
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ::~list(&this->damagelist);
  return;
}

Assistant:

NPC::~NPC()
{
	UTIL_FOREACH(this->map->characters, character)
	{
		if (character->npc == this)
		{
			character->npc = 0;
			character->npc_type = ENF::NPC;
		}
	}

	UTIL_FOREACH_CREF(this->damagelist, opponent)
	{
		opponent->attacker->unregister_npc.erase(
			std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), this),
			opponent->attacker->unregister_npc.end()
		);
	}
}